

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int monteCarloBiomes(Generator *g,Range r,uint64_t *rng,double coverage,double confidence,
                    _func_int_Generator_ptr_int_int_int_int_void_ptr *eval,void *data)

{
  bool bVar1;
  int n;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double local_d0;
  double hi;
  double lo;
  double whi;
  double wlo;
  
  n = r.sy + (uint)(r.sy == 0);
  uVar12 = (long)r.sx * (long)r.sz * (long)n;
  dVar13 = inverf(confidence);
  dVar13 = dVar13 * 1.4142135623730951;
  auVar15._8_4_ = (int)(uVar12 >> 0x20);
  auVar15._0_8_ = uVar12;
  auVar15._12_4_ = 0x45300000;
  dVar16 = (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
  dVar14 = SQRT(dVar16) * dVar13;
  wilson(dVar14,coverage,dVar13,&wlo,&whi);
  __ptr = (void *)0x0;
  bVar1 = true;
  if ((uVar12 < 0x7fffffff) && (dVar16 < dVar14 * 4.0)) {
    __ptr = malloc(uVar12 * 0xc);
    iVar2 = 0;
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      iVar3 = 0;
      if (0 < r.sx) {
        iVar3 = r.sx;
      }
      iVar4 = 0;
      if (0 < r.sz) {
        iVar4 = r.sz;
      }
      iVar5 = 0;
      if (0 < n) {
        iVar5 = n;
      }
      lVar9 = 0;
      while( true ) {
        iVar6 = 0;
        bVar1 = false;
        if (iVar2 == iVar5) break;
        for (; iVar6 != iVar4; iVar6 = iVar6 + 1) {
          piVar10 = (int *)((long)__ptr + lVar9 * 0xc + 8);
          for (lVar11 = 0; iVar3 != (int)lVar11; lVar11 = lVar11 + 1) {
            piVar10[-2] = (int)lVar11;
            piVar10[-1] = iVar2;
            *piVar10 = iVar6;
            piVar10 = piVar10 + 3;
          }
          lVar9 = lVar9 + lVar11;
        }
        iVar2 = iVar2 + 1;
      }
    }
  }
  dVar14 = 0.0;
  local_d0 = 0.0;
  do {
    do {
      uVar8 = uVar12 - 1;
      if (uVar12 == 0) {
LAB_0010c251:
        uVar7 = 1;
        goto LAB_0010c269;
      }
      if (bVar1) {
        iVar2 = nextInt(rng,r.sx);
        iVar3 = nextInt(rng,n);
        iVar4 = nextInt(rng,r.sz);
      }
      else {
        iVar5 = nextInt(rng,(int)uVar12);
        lVar9 = (long)iVar5 * 0xc;
        iVar2 = *(int *)((long)__ptr + lVar9);
        iVar3 = *(int *)((long)__ptr + lVar9 + 4);
        iVar4 = *(int *)((long)__ptr + lVar9 + 8);
        iVar6 = (int)uVar12 + -1;
        if (iVar6 != iVar5) {
          lVar11 = (long)iVar6 * 0xc;
          *(undefined4 *)((undefined8 *)(lVar9 + (long)__ptr) + 1) =
               *(undefined4 *)((long)__ptr + lVar11 + 8);
          *(undefined8 *)(lVar9 + (long)__ptr) = *(undefined8 *)((long)__ptr + lVar11);
          *(int *)((long)__ptr + lVar11) = iVar2;
          *(int *)((long)__ptr + lVar11 + 4) = iVar3;
          *(int *)((long)__ptr + lVar11 + 8) = iVar4;
        }
      }
      iVar2 = (*eval)(g,r.scale,iVar2 + r.x,iVar3 + r.y,iVar4 + r.z,data);
      uVar12 = uVar8;
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      if (iVar2 == 1) {
        dVar14 = dVar14 + 1.0;
        goto LAB_0010c1b2;
      }
LAB_0010c256:
      uVar7 = 0;
      goto LAB_0010c269;
    }
LAB_0010c1b2:
    local_d0 = local_d0 + 1.0;
    dVar16 = 1.0 / local_d0;
    wilson(local_d0,dVar16 * dVar14,dVar13,&lo,&hi);
    if (coverage < lo - dVar16) goto LAB_0010c251;
    if (dVar16 + hi < coverage) goto LAB_0010c256;
    if (hi - lo < whi - wlo) {
      uVar7 = (uint)(coverage < dVar16 * dVar14);
LAB_0010c269:
      free(__ptr);
      return uVar7;
    }
  } while( true );
}

Assistant:

int monteCarloBiomes(
        Generator         * g,
        Range               r,
        uint64_t          * rng,
        double              coverage,
        double              confidence,
        int (*eval)(Generator *g, int scale, int x, int y, int z, void*),
        void              * data
        )
{
    if (r.sy == 0)
        r.sy = 1;

    struct touple { int x, y, z; } *buf = 0;
    size_t n = (size_t)r.sx*r.sy*r.sz;

    // z-score (i.e. probit, or standard deviations) for the confidence
    double zscore = sqrt(2.0) * inverf(confidence);

    // One standard deviation is approximately given by sqrt(n) elements,
    // hence we will take zscore * sqrt(n) as the maximum number of samples
    // to reach the desired confidence. This gives us a wilson score interval
    // for the upper and lower bound of successes we aim for.
    double wn = zscore * sqrt(n);
    double wlo, whi;
    wilson(wn, coverage, zscore, &wlo, &whi);

    // When the number of samples approaches the total number elements,
    // we can avoid repeated samples by shuffling a buffer.
    // (TODO: adjust for hypergeometric distribution?)
    if (n < 4 * wn && n < INT_MAX)
        buf = (struct touple*) malloc(n * sizeof(*buf));

    if (buf)
    {
        size_t idx = 0;
        int i, k, j;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    buf[idx].x = i;
                    buf[idx].y = k;
                    buf[idx].z = j;
                    idx++;
                }
            }
        }
    }

    size_t i = 0;
    double m = 0; // number of samples
    double x = 0; // number of successes
    int ret = 1;

    // iterate over the area in a random order
    for (i = 0; i < n; i++)
    {
        struct touple t;
        if (buf)
        {
            int j = n - i;
            int k = nextInt(rng, j);
            t = buf[k];
            if (k != j-1)
            {
                buf[k] = buf[j-1];
                buf[j-1] = t;
            }
        }
        else
        {
            t.x = nextInt(rng, r.sx);
            t.y = nextInt(rng, r.sy);
            t.z = nextInt(rng, r.sz);
        }

        int status = eval(g, r.scale, r.x+t.x, r.y+t.y, r.z+t.z, data);
        if (status == -1)
            continue;
        else if (status == 0)
            ;
        else if (status == 1)
            x += 1.0;
        else
        {
            ret = 0;
            break;
        }
        m += 1.0;

        // check if we can abort early with the current confidence interval
        double per_m = 1.0 / m;
        double lo, hi;
        wilson(m, x * per_m, zscore, &lo, &hi);

        if (lo - per_m > coverage)
        {
            ret = 1;
            break;
        }
        if (hi + per_m < coverage)
        {
            ret = 0;
            break;
        }

        if (hi - lo < whi - wlo)
        {   // should occur around i ~ wn
            ret = x * per_m > coverage;
            break;
        }
    }
    if (buf)
        free(buf);
    return ret;
}